

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_TimedText.cpp
# Opt level: O1

h__Reader * __thiscall
ASDCP::TimedText::MXFReader::h__Reader::ReadAncillaryResource
          (h__Reader *this,byte_t *uuid,FrameBuffer *frame_buf,AESDecContext *Ctx,HMACContext *HMAC)

{
  h__AESContext *phVar1;
  iterator iVar2;
  ILogSink *pIVar3;
  undefined8 uVar4;
  undefined1 *puVar5;
  InterchangeObject *tmp_iobj;
  UUID RID;
  char buf [64];
  undefined1 local_b8 [17];
  byte_t *pbStack_a7;
  char local_98 [104];
  
  if (frame_buf == (FrameBuffer *)0x0) {
    pIVar3 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error
              (pIVar3,"NULL pointer in file %s, line %d\n",
               "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_DCP_TimedText.cpp"
               ,0x101);
    puVar5 = Kumu::RESULT_PTR;
  }
  else {
    local_b8[8] = true;
    local_b8._9_8_ = (frame_buf->super_FrameBuffer)._vptr_FrameBuffer;
    pbStack_a7 = (frame_buf->super_FrameBuffer).m_Data;
    local_b8._0_8_ = &PTR__IArchive_00223d80;
    iVar2 = std::
            _Rb_tree<Kumu::UUID,_std::pair<const_Kumu::UUID,_Kumu::UUID>,_std::_Select1st<std::pair<const_Kumu::UUID,_Kumu::UUID>_>,_std::less<Kumu::UUID>,_std::allocator<std::pair<const_Kumu::UUID,_Kumu::UUID>_>_>
            ::find((_Rb_tree<Kumu::UUID,_std::pair<const_Kumu::UUID,_Kumu::UUID>,_std::_Select1st<std::pair<const_Kumu::UUID,_Kumu::UUID>_>,_std::less<Kumu::UUID>,_std::allocator<std::pair<const_Kumu::UUID,_Kumu::UUID>_>_>
                    *)(uuid + 0x660),(key_type *)local_b8);
    if (iVar2._M_node != (_Base_ptr)(uuid + 0x668)) {
      MXF::OP1aHeader::GetMDObjectByID
                ((OP1aHeader *)this,(UUID *)(uuid + 0x18),(InterchangeObject **)(iVar2._M_node + 2))
      ;
      if (-1 < *(int *)&(this->super_h__ASDCPReader).
                        super_TrackFileReader<ASDCP::MXF::OP1aHeader,_ASDCP::MXF::OPAtomIndexFooter>
                        ._vptr_TrackFileReader) {
        __assert_fail("desc_object",
                      "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_DCP_TimedText.cpp"
                      ,0x113,
                      "ASDCP::Result_t ASDCP::TimedText::MXFReader::h__Reader::ReadAncillaryResource(const byte_t *, FrameBuffer &, AESDecContext *, HMACContext *)"
                     );
      }
      if (*(int *)&(this->super_h__ASDCPReader).
                   super_TrackFileReader<ASDCP::MXF::OP1aHeader,_ASDCP::MXF::OPAtomIndexFooter>.
                   _vptr_TrackFileReader < 0) {
        return this;
      }
      phVar1 = (h__AESContext *)(frame_buf->super_FrameBuffer).m_Data;
      Ctx[5].m_Context.m_p = (h__AESContext *)(frame_buf->super_FrameBuffer)._vptr_FrameBuffer;
      Ctx[6].m_Context.m_p = phVar1;
      std::__cxx11::string::_M_assign((string *)(Ctx + 7));
      return this;
    }
    pIVar3 = (ILogSink *)Kumu::DefaultLogSink();
    uVar4 = Kumu::bin2UUIDhex(local_b8 + 9,0x10,local_98,0x40);
    Kumu::ILogSink::Error(pIVar3,"No such resource: %s\n",uVar4);
    puVar5 = ASDCP::RESULT_RANGE;
  }
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)puVar5);
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::TimedText::MXFReader::h__Reader::ReadAncillaryResource(const byte_t* uuid, FrameBuffer& frame_buf,
							      AESDecContext* Ctx, HMACContext* HMAC)
{
  KM_TEST_NULL_L(uuid);
  UUID RID(uuid);

  ResourceMap_t::const_iterator ri = m_ResourceMap.find(RID);
  if ( ri == m_ResourceMap.end() )
    {
      char buf[64];
      DefaultLogSink().Error("No such resource: %s\n", RID.EncodeHex(buf, 64));
      return RESULT_RANGE;
    }

  // get the subdescriptor
  InterchangeObject* tmp_iobj = 0;
  Result_t result = m_HeaderPart.GetMDObjectByID((*ri).second, &tmp_iobj);
  TimedTextResourceSubDescriptor* desc_object = dynamic_cast<TimedTextResourceSubDescriptor*>(tmp_iobj);

  if ( KM_SUCCESS(result) )
    {
      assert(desc_object);
      result = ReadGenericStreamPartitionPayload(desc_object->EssenceStreamID, frame_buf, Ctx, HMAC);
    }

  if ( KM_SUCCESS(result) )
    {
      frame_buf.AssetID(uuid);
      frame_buf.MIMEType(desc_object->MIMEMediaType);
    }

  return result;
}